

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_Leader::GetArrowHeadDirection(ON_OBSOLETE_V5_Leader *this,ON_2dVector *arrowhead_dir)

{
  ON_2dPoint *this_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  ON_2dVector OVar4;
  
  lVar3 = (long)(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                m_count;
  if (lVar3 < 2) {
    ON_2dVector::Set(arrowhead_dir,-1.0,0.0);
    bVar1 = false;
  }
  else {
    lVar2 = 0x10;
    do {
      this_00 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                m_a;
      OVar4 = ON_2dPoint::operator-(this_00,(ON_2dPoint *)((long)&this_00->x + lVar2));
      *arrowhead_dir = OVar4;
      bVar1 = ON_2dVector::Unitize(arrowhead_dir);
      if (bVar1) {
        return bVar1;
      }
      ON_2dVector::Set(arrowhead_dir,-1.0,0.0);
      lVar2 = lVar2 + 0x10;
    } while (lVar3 * 0x10 != lVar2);
  }
  return bVar1;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetArrowHeadDirection( ON_2dVector& arrowhead_dir ) const
{
  bool rc = false;
  const int point_count = m_points.Count();
  if ( point_count < 2 )
  {
    arrowhead_dir.Set(-1.0,0.0);
  }
  else
  {
    int i;
    for ( i = 1; i < point_count; i++ )
    {
      arrowhead_dir = m_points[0] -  m_points[i];
      if ( arrowhead_dir.Unitize() )
      {
        rc = true;
        break;
      }
      arrowhead_dir.Set(-1.0,0.0);
    }
  }
  return rc;
}